

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void printPixelType(PixelType pt)

{
  ostream *this;
  char *pcVar1;
  
  if (pt == FLOAT) {
    pcVar1 = "32-bit floating-point";
  }
  else if (pt == HALF) {
    pcVar1 = "16-bit floating-point";
  }
  else {
    if (pt != UINT) {
      this = std::operator<<((ostream *)&std::cout,"type ");
      std::ostream::operator<<(this,pt);
      return;
    }
    pcVar1 = "32-bit unsigned integer";
  }
  std::operator<<((ostream *)&std::cout,pcVar1);
  return;
}

Assistant:

void
printPixelType (PixelType pt)
{
    switch (pt)
    {
        case UINT: cout << "32-bit unsigned integer"; break;

        case HALF: cout << "16-bit floating-point"; break;

        case FLOAT: cout << "32-bit floating-point"; break;

        default: cout << "type " << int (pt); break;
    }
}